

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbaseconfig.cpp
# Opt level: O3

void __thiscall MBaseConfig::save(MBaseConfig *this,QString *fileName,Format *format)

{
  QSettings settings;
  QSettings local_20 [16];
  
  if ((fileName->d).ptr == (char16_t *)0x0) {
    QSettings::QSettings(local_20,(QObject *)0x0);
    save::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this,local_20);
  }
  else {
    QSettings::QSettings(local_20,fileName,*format,(QObject *)0x0);
    save::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this,local_20);
  }
  QSettings::~QSettings(local_20);
  return;
}

Assistant:

void MBaseConfig::save(const QString &fileName, const QSettings::Format &format)
{
    auto saveTo = [this](QSettings &settings) {
        settings.beginGroup(m_groupName);
        const auto &values = valueNames();
        for (auto key : values) {
            auto val = value(key);
#ifdef ENCRYPTED_CONFIG
            if (m_passphrase.size()) {
                key = m_crypto.encrypt(key, m_passphrase);
                val = m_crypto.encrypt(val.toByteArray(), m_passphrase);
            }
#endif
            settings.setValue(key, val);
        }
    };

    if (fileName.isNull()) {
        QSettings settings;
        saveTo(settings);
    } else {
        QSettings settings(fileName, format);
        saveTo(settings);
    }
}